

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

FileStream * __thiscall wabt::FileStream::operator=(FileStream *this,FileStream *other)

{
  FileStream *other_local;
  FileStream *this_local;
  
  this->file_ = other->file_;
  this->offset_ = other->offset_;
  this->should_close_ = (bool)(other->should_close_ & 1);
  other->file_ = (FILE *)0x0;
  other->offset_ = 0;
  other->should_close_ = false;
  return this;
}

Assistant:

FileStream& FileStream::operator=(FileStream&& other) {
  file_ = other.file_;
  offset_ = other.offset_;
  should_close_ = other.should_close_;
  other.file_ = nullptr;
  other.offset_ = 0;
  other.should_close_ = false;
  return *this;
}